

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain_vine_swap.h
# Opt level: O3

Index __thiscall
Gudhi::persistence_matrix::
Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>
::vine_swap(Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>
            *this,Index columnIndex1,Index columnIndex2)

{
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this_00;
  uint uVar1;
  int iVar2;
  bool bVar3;
  Index IVar4;
  iterator iVar5;
  const_iterator cVar6;
  long *plVar7;
  __hashtable *__h;
  Index local_4c;
  anon_class_24_3_95756d54 local_48;
  
  this_00 = (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             *)((long)&this[1].birthComp_.super__Function_base._M_functor._M_unused + 8);
  local_48.col._0_4_ = columnIndex1;
  iVar5 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(this_00,(key_type *)&local_48);
  if (iVar5.
      super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>_>,_false>
      ._M_cur == (__node_type *)0x0) goto LAB_001dcbe8;
  local_48.col._0_4_ =
       *(Index *)((long)iVar5.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>_>,_false>
                        ._M_cur + 0x28);
  if ((Index)local_48.col == 0xffffffff) {
    bVar3 = false;
  }
  else {
    uVar1 = *(uint *)((long)iVar5.
                            super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>_>,_false>
                            ._M_cur + 0x24);
    iVar5 = std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(this_00,(key_type *)&local_48);
    if (iVar5.
        super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>_>,_false>
        ._M_cur == (__node_type *)0x0) goto LAB_001dcbe8;
    bVar3 = *(uint *)((long)iVar5.
                            super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>_>,_false>
                            ._M_cur + 0x24) < uVar1;
  }
  local_48.col._0_4_ = columnIndex2;
  iVar5 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(this_00,(key_type *)&local_48);
  if (iVar5.
      super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>_>,_false>
      ._M_cur == (__node_type *)0x0) goto LAB_001dcbe8;
  local_48.col._0_4_ =
       *(Index *)((long)iVar5.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>_>,_false>
                        ._M_cur + 0x28);
  local_48.this =
       (Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>
        *)this;
  if ((Index)local_48.col == 0xffffffff) {
    if (!bVar3) {
LAB_001dcb88:
      local_48.col._0_4_ = columnIndex1;
      iVar5 = std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(this_00,(key_type *)&local_48);
      if (iVar5.
          super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>_>,_false>
          ._M_cur != (__node_type *)0x0) {
        iVar2 = *(int *)((long)iVar5.
                               super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>_>,_false>
                               ._M_cur + 0x24);
        local_48.col._0_4_ = columnIndex2;
        cVar6 = std::
                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(this_00,(key_type *)&local_48);
        if (cVar6.
            super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>_>,_false>
            ._M_cur != (__node_type *)0x0) {
          plVar7 = (long *)((long)cVar6.
                                  super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>_>,_false>
                                  ._M_cur + 0x40);
          do {
            plVar7 = (long *)*plVar7;
            if (plVar7 == (long *)((long)cVar6.
                                         super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>_>,_false>
                                         ._M_cur + 0x40)) {
              return columnIndex1;
            }
          } while (*(int *)(plVar7 + 2) != iVar2);
          IVar4 = _positive_vine_swap(this,columnIndex1,columnIndex2);
          return IVar4;
        }
      }
      goto LAB_001dcbe8;
    }
  }
  else {
    uVar1 = *(uint *)((long)iVar5.
                            super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>_>,_false>
                            ._M_cur + 0x24);
    iVar5 = std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(this_00,(key_type *)&local_48);
    if (iVar5.
        super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>_>,_false>
        ._M_cur == (__node_type *)0x0) goto LAB_001dcbe8;
    if (bVar3 && *(uint *)((long)iVar5.
                                 super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>_>,_false>
                                 ._M_cur + 0x24) < uVar1) {
      local_48.col._0_4_ = columnIndex1;
      iVar5 = std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(this_00,(key_type *)&local_48);
      if (iVar5.
          super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>_>,_false>
          ._M_cur != (__node_type *)0x0) {
        iVar2 = *(int *)((long)iVar5.
                               super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>_>,_false>
                               ._M_cur + 0x24);
        local_48.col._0_4_ = columnIndex2;
        cVar6 = std::
                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(this_00,(key_type *)&local_48);
        if (cVar6.
            super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>_>,_false>
            ._M_cur != (__node_type *)0x0) {
          plVar7 = (long *)((long)cVar6.
                                  super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>_>,_false>
                                  ._M_cur + 0x40);
          do {
            plVar7 = (long *)*plVar7;
            if (plVar7 == (long *)((long)cVar6.
                                         super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>_>,_false>
                                         ._M_cur + 0x40)) {
              return columnIndex1;
            }
          } while (*(int *)(plVar7 + 2) != iVar2);
          IVar4 = _negative_vine_swap(this,columnIndex1,columnIndex2);
          return IVar4;
        }
      }
      goto LAB_001dcbe8;
    }
    if (!bVar3) {
      if (*(uint *)((long)iVar5.
                          super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>_>,_false>
                          ._M_cur + 0x24) < uVar1) {
        local_48.col._0_4_ = columnIndex1;
        iVar5 = std::
                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(this_00,(key_type *)&local_48);
        if (iVar5.
            super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>_>,_false>
            ._M_cur != (__node_type *)0x0) {
          iVar2 = *(int *)((long)iVar5.
                                 super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>_>,_false>
                                 ._M_cur + 0x24);
          local_48.col._0_4_ = columnIndex2;
          cVar6 = std::
                  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find(this_00,(key_type *)&local_48);
          if (cVar6.
              super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>_>,_false>
              ._M_cur != (__node_type *)0x0) {
            plVar7 = (long *)((long)cVar6.
                                    super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>_>,_false>
                                    ._M_cur + 0x40);
            do {
              plVar7 = (long *)*plVar7;
              if (plVar7 == (long *)((long)cVar6.
                                           super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>_>,_false>
                                           ._M_cur + 0x40)) {
                return columnIndex1;
              }
            } while (*(int *)(plVar7 + 2) != iVar2);
            local_4c = columnIndex1;
            local_48.col._0_4_ = columnIndex2;
            iVar5 = std::
                    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    ::find(this_00,(key_type *)&local_48);
            if (iVar5.
                super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>_>,_false>
                ._M_cur != (__node_type *)0x0) {
              local_48.col = (Column *)
                             ((long)iVar5.
                                    super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>_>,_false>
                                    ._M_cur + 0x10);
              local_48.sourceColumnIndex = &local_4c;
              Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,false,false>>>
              ::
              _add_to<Gudhi::persistence_matrix::Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,false,false>>>::add_to(unsigned_int,unsigned_int)::_lambda()_1_>
                        ((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,false,false>>>
                          *)this,local_48.col,&local_48);
              return columnIndex1;
            }
          }
        }
        goto LAB_001dcbe8;
      }
      goto LAB_001dcb88;
    }
  }
  local_48.col._0_4_ = columnIndex1;
  iVar5 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(this_00,(key_type *)&local_48);
  if (iVar5.
      super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>_>,_false>
      ._M_cur != (__node_type *)0x0) {
    iVar2 = *(int *)((long)iVar5.
                           super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>_>,_false>
                           ._M_cur + 0x24);
    local_48.col._0_4_ = columnIndex2;
    cVar6 = std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(this_00,(key_type *)&local_48);
    if (cVar6.
        super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>_>,_false>
        ._M_cur != (__node_type *)0x0) {
      plVar7 = (long *)((long)cVar6.
                              super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>_>,_false>
                              ._M_cur + 0x40);
      do {
        plVar7 = (long *)*plVar7;
        if (plVar7 == (long *)((long)cVar6.
                                     super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>_>,_false>
                                     ._M_cur + 0x40)) {
          return columnIndex1;
        }
      } while (*(int *)(plVar7 + 2) != iVar2);
      local_4c = columnIndex2;
      local_48.col._0_4_ = columnIndex1;
      iVar5 = std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(this_00,(key_type *)&local_48);
      if (iVar5.
          super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>_>,_false>
          ._M_cur != (__node_type *)0x0) {
        local_48.col = (Column *)
                       ((long)iVar5.
                              super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>_>,_false>
                              ._M_cur + 0x10);
        local_48.sourceColumnIndex = &local_4c;
        Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,false,false>>>
        ::
        _add_to<Gudhi::persistence_matrix::Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,false,false>>>::add_to(unsigned_int,unsigned_int)::_lambda()_1_>
                  ((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,false,false>>>
                    *)this,local_48.col,&local_48);
        return columnIndex2;
      }
    }
  }
LAB_001dcbe8:
  std::__throw_out_of_range("_Map_base::at");
}

Assistant:

inline typename Chain_vine_swap<Master_matrix>::Index Chain_vine_swap<Master_matrix>::vine_swap(Index columnIndex1,
                                                                                                Index columnIndex2)
{
  if constexpr (Master_matrix::Option_list::has_column_pairings) {
    GUDHI_CHECK(CP::are_adjacent(_matrix()->get_pivot(columnIndex1), _matrix()->get_pivot(columnIndex2)),
                std::invalid_argument(
                    "Chain_vine_swap::vine_swap - Columns to be swapped need to be adjacent in the 'real' matrix."));
  }

  const bool col1IsNeg = _is_negative_in_pair(columnIndex1);
  const bool col2IsNeg = _is_negative_in_pair(columnIndex2);

  if (col1IsNeg && col2IsNeg) {
    if (_matrix()->is_zero_entry(columnIndex2, _matrix()->get_pivot(columnIndex1))) {
      if constexpr (Master_matrix::Option_list::has_column_pairings) {
        ID_index pivot1 = _matrix()->get_pivot(columnIndex1);
        ID_index pivot2 = _matrix()->get_pivot(columnIndex2);

        CP::negative_transpose(pivot1, pivot2);
        CP::swap_positions(pivot1, pivot2);
      }
      return columnIndex1;
    }
    return _negative_vine_swap(columnIndex1, columnIndex2);
  }

  if (col1IsNeg) {
    if (_matrix()->is_zero_entry(columnIndex2, _matrix()->get_pivot(columnIndex1))) {
      if constexpr (Master_matrix::Option_list::has_column_pairings) {
        ID_index pivot1 = _matrix()->get_pivot(columnIndex1);
        ID_index pivot2 = _matrix()->get_pivot(columnIndex2);

        CP::negative_positive_transpose(pivot1, pivot2);
        CP::swap_positions(pivot1, pivot2);
      }
      return columnIndex1;
    }
    return _negative_positive_vine_swap(columnIndex1, columnIndex2);
  }

  if (col2IsNeg) {
    if (_matrix()->is_zero_entry(columnIndex2, _matrix()->get_pivot(columnIndex1))) {
      if constexpr (Master_matrix::Option_list::has_column_pairings) {
        ID_index pivot1 = _matrix()->get_pivot(columnIndex1);
        ID_index pivot2 = _matrix()->get_pivot(columnIndex2);

        CP::positive_negative_transpose(pivot1, pivot2);
        CP::swap_positions(pivot1, pivot2);
      }
      return columnIndex1;
    }
    return _positive_negative_vine_swap(columnIndex1, columnIndex2);
  }

  if (_matrix()->is_zero_entry(columnIndex2, _matrix()->get_pivot(columnIndex1))) {
    if constexpr (Master_matrix::Option_list::has_column_pairings) {
      ID_index pivot1 = _matrix()->get_pivot(columnIndex1);
      ID_index pivot2 = _matrix()->get_pivot(columnIndex2);

      CP::positive_transpose(pivot1, pivot2);
      CP::swap_positions(pivot1, pivot2);
    }
    return columnIndex1;
  }
  return _positive_vine_swap(columnIndex1, columnIndex2);
}